

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O1

void __thiscall
NativeEntryPointData::FreeNativeCode
          (NativeEntryPointData *this,ScriptContext *scriptContext,bool isShutdown)

{
  XDataAllocation *xdataInfo;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  xdataInfo = (this->xdataInfo).ptr;
  if (xdataInfo != (XDataAllocation *)0x0) {
    Memory::XDataAllocator::Unregister(xdataInfo);
    (this->xdataInfo).ptr = (XDataAllocation *)0x0;
  }
  if ((!isShutdown) && (this->nativeAddress != (Type)0x0)) {
    if ((this->validationCookie).ptr == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                         ,0x4c,"(this->validationCookie != nullptr)",
                         "this->validationCookie != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if ((NativeCodeGenerator *)(this->validationCookie).ptr == scriptContext->nativeCodeGen) {
      FreeNativeCodeGenAllocation
                (scriptContext,(JavascriptMethod)this->nativeAddress,
                 (JavascriptMethod)this->thunkAddress);
    }
  }
  this->nativeAddress = (Type)0x0;
  this->thunkAddress = (Type)0x0;
  this->codeSize = 0;
  return;
}

Assistant:

void
NativeEntryPointData::FreeNativeCode(ScriptContext * scriptContext, bool isShutdown)
{
#if PDATA_ENABLED
    this->CleanupXDataInfo();
#endif

    // if scriptContext is shutting down, no need to free that native code
    if (!isShutdown && this->nativeAddress != nullptr)
    {
        // In the debugger case, we might call cleanup after the native code gen that
        // allocated this entry point has already shutdown. In that case, the validation
        // check below should fail and we should not try to free this entry point
        // since it's already been freed
        Assert(this->validationCookie != nullptr);
        if (this->validationCookie == scriptContext->GetNativeCodeGenerator())
        {
            FreeNativeCodeGenAllocation(scriptContext, this->nativeAddress, this->thunkAddress);
        }
    }

#ifdef PERF_COUNTERS
    PERF_COUNTER_SUB(Code, TotalNativeCodeSize, codeSize);
    PERF_COUNTER_SUB(Code, FunctionNativeCodeSize,codeSize);
    PERF_COUNTER_SUB(Code, DynamicNativeCodeSize, codeSize);
#endif

    this->nativeAddress = nullptr;
    this->thunkAddress = nullptr;
    this->codeSize = 0;
}